

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

void * TrainModelThread(void *id)

{
  vocab_word *pvVar1;
  longlong lVar2;
  int *piVar3;
  vocab_word *pvVar4;
  real *prVar5;
  real *prVar6;
  real *prVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  void *__ptr;
  void *__ptr_00;
  FILE *__stream;
  long lVar11;
  clock_t cVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  void *pvVar26;
  float fVar27;
  float fVar28;
  double dVar29;
  long local_2008;
  long local_1ff8;
  long local_1fe8;
  longlong local_1fc0;
  longlong sen [1001];
  
  lVar2 = layer1_size;
  local_1fc0 = iter;
  __ptr = calloc(layer1_size,4);
  __ptr_00 = calloc(lVar2,4);
  printf("Opening train file %s\n",train_file);
  __stream = fopen(train_file,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"no such file or directory: %s",train_file);
    exit(1);
  }
  pvVar26 = id;
  if ((long)num_threads < 2) {
    local_2008 = 0;
    goto LAB_0010324a;
  }
  lVar11 = file_size / (long)num_threads;
  local_2008 = 0;
LAB_00103237:
  fseek(__stream,lVar11 * (long)id,0);
LAB_0010324a:
  local_1ff8 = 0;
  local_1fe8 = 0;
  lVar11 = 0;
  do {
    if (10000 < local_1ff8 - local_1fe8) {
      word_count_actual = (local_1ff8 - local_1fe8) + word_count_actual;
      if (1 < debug_mode) {
        cVar12 = clock();
        printf("%cAlpha: %f  Progress: %.2f%%  Words/thread/sec: %.2fk  ",(double)alpha,
               (double)(((float)word_count_actual / (float)(train_words * iter + 1)) * 100.0),
               (double)((float)word_count_actual /
                       (((float)((cVar12 - start) + 1) / 1e+06) * 1000.0)),0xd);
        fflush(_stdout);
      }
      alpha = (1.0 - (float)word_count_actual / (float)(train_words * iter + 1)) * starting_alpha;
      local_1fe8 = local_1ff8;
      if (alpha < starting_alpha * 0.0001) {
        alpha = starting_alpha * 0.0001;
      }
    }
    if (lVar11 == 0) {
      lVar18 = 0;
LAB_001033a9:
      do {
        do {
          lVar11 = lVar18;
          iVar8 = ReadWordIndex((FILE *)__stream);
          iVar9 = feof(__stream);
          if (iVar9 != 0) {
LAB_001034b6:
            local_2008 = 0;
            goto LAB_001034c1;
          }
          lVar18 = lVar11;
        } while (iVar8 == -1);
        local_1ff8 = local_1ff8 + 1;
        if (iVar8 == 0) goto LAB_001034b6;
        lVar25 = (long)iVar8;
        if (0.0 < sample) {
          dVar29 = (double)((float)vocab[lVar25].cn / (sample * (float)train_words));
          if (dVar29 < 0.0) {
            dVar29 = sqrt(dVar29);
          }
          else {
            dVar29 = SQRT(dVar29);
          }
          pvVar26 = (void *)((long)pvVar26 * 0x5deece66d + 0xb);
          if ((float)(((double)((float)train_words * sample) * (dVar29 + 1.0)) /
                     (double)vocab[lVar25].cn) < (float)((uint)pvVar26 & 0xffff) * 1.5258789e-05)
          goto LAB_001033a9;
        }
        sen[lVar11] = lVar25;
        lVar18 = lVar11 + 1;
        lVar11 = 1000;
        local_2008 = 0;
      } while (lVar18 != 1000);
    }
LAB_001034c1:
    iVar8 = feof(__stream);
    lVar2 = layer1_size;
    if ((iVar8 != 0) || (train_words / (long)num_threads < local_1ff8)) break;
    lVar18 = sen[local_2008];
    if (lVar18 != -1) {
      lVar25 = 0;
      if (0 < layer1_size) {
        lVar25 = layer1_size;
      }
      for (lVar13 = 0; lVar25 != lVar13; lVar13 = lVar13 + 1) {
        *(undefined4 *)((long)__ptr + lVar13 * 4) = 0;
      }
      for (lVar13 = 0; prVar5 = syn0, pvVar4 = vocab, iVar9 = hs, iVar8 = negative, lVar25 != lVar13
          ; lVar13 = lVar13 + 1) {
        *(undefined4 *)((long)__ptr_00 + lVar13 * 4) = 0;
      }
      pvVar26 = (void *)((long)pvVar26 * 0x5deece66d + 0xb);
      uVar24 = (ulong)window;
      uVar17 = (ulong)pvVar26 % uVar24;
      lVar13 = (uVar24 * 2 + 1) - uVar17;
      lVar14 = local_2008 - uVar24;
      if (cbow == 0) {
        pvVar1 = vocab + lVar18;
        uVar10 = negative + 1;
        for (; (long)uVar17 < lVar13; uVar17 = uVar17 + 1) {
          if ((((uVar17 != uVar24) && (lVar15 = uVar17 + lVar14, -1 < lVar15)) && (lVar15 < lVar11))
             && (lVar15 = sen[lVar15], lVar15 != -1)) {
            for (lVar22 = 0; prVar5 = expTable, lVar25 != lVar22; lVar22 = lVar22 + 1) {
              *(undefined4 *)((long)__ptr_00 + lVar22 * 4) = 0;
            }
            lVar15 = lVar15 * lVar2;
            if (iVar9 != 0) {
              bVar16 = (byte)*(undefined4 *)&pvVar4[lVar18].codelen;
              if ((char)bVar16 < '\x01') {
                bVar16 = 0;
              }
              for (uVar20 = 0; prVar7 = syn1, prVar6 = syn0, uVar20 != bVar16; uVar20 = uVar20 + 1)
              {
                lVar23 = pvVar4[lVar18].point[uVar20] * lVar2;
                fVar27 = 0.0;
                for (lVar22 = 0; lVar25 != lVar22; lVar22 = lVar22 + 1) {
                  fVar27 = fVar27 + syn0[lVar15 + lVar22] * syn1[lVar23 + lVar22];
                }
                if (ABS(fVar27) < 6.0) {
                  fVar27 = ((float)(1 - pvVar1->code[uVar20]) - prVar5[(int)((fVar27 + 6.0) * 83.0)]
                           ) * alpha;
                  for (lVar22 = 0; lVar25 != lVar22; lVar22 = lVar22 + 1) {
                    *(float *)((long)__ptr_00 + lVar22 * 4) =
                         prVar7[lVar23 + lVar22] * fVar27 + *(float *)((long)__ptr_00 + lVar22 * 4);
                  }
                  for (lVar22 = 0; lVar25 != lVar22; lVar22 = lVar22 + 1) {
                    prVar7[lVar23 + lVar22] =
                         prVar6[lVar15 + lVar22] * fVar27 + prVar7[lVar23 + lVar22];
                  }
                }
              }
            }
            prVar5 = expTable;
            piVar3 = table;
            if (0 < iVar8) {
              uVar20 = vocab_size - 1;
              for (uVar19 = 0; prVar7 = syn1neg, prVar6 = syn0, uVar19 != uVar10;
                  uVar19 = uVar19 + 1) {
                if (uVar19 == 0) {
                  iVar21 = 1;
                  lVar22 = lVar18;
LAB_00103ae4:
                  lVar22 = lVar22 * lVar2;
                  fVar27 = 0.0;
                  for (lVar23 = 0; lVar25 != lVar23; lVar23 = lVar23 + 1) {
                    fVar27 = fVar27 + syn0[lVar15 + lVar23] * syn1neg[lVar22 + lVar23];
                  }
                  if (fVar27 <= 6.0) {
                    fVar28 = (float)iVar21;
                    if (-6.0 <= fVar27) {
                      fVar28 = fVar28 - prVar5[(int)((fVar27 + 6.0) * 83.0)];
                    }
                  }
                  else {
                    fVar28 = (float)(iVar21 + -1);
                  }
                  fVar28 = fVar28 * alpha;
                  for (lVar23 = 0; lVar25 != lVar23; lVar23 = lVar23 + 1) {
                    *(float *)((long)__ptr_00 + lVar23 * 4) =
                         prVar7[lVar22 + lVar23] * fVar28 + *(float *)((long)__ptr_00 + lVar23 * 4);
                  }
                  for (lVar23 = 0; lVar25 != lVar23; lVar23 = lVar23 + 1) {
                    prVar7[lVar22 + lVar23] =
                         prVar6[lVar15 + lVar23] * fVar28 + prVar7[lVar22 + lVar23];
                  }
                }
                else {
                  pvVar26 = (void *)((long)pvVar26 * 0x5deece66d + 0xb);
                  lVar22 = (long)piVar3[((ulong)pvVar26 >> 0x10) % 100000000];
                  if (lVar22 == 0) {
                    lVar22 = (ulong)pvVar26 % uVar20 + 1;
                  }
                  if (lVar22 != lVar18) {
                    iVar21 = 0;
                    goto LAB_00103ae4;
                  }
                }
              }
            }
            prVar5 = syn0;
            for (lVar22 = 0; lVar25 != lVar22; lVar22 = lVar22 + 1) {
              prVar5[lVar15 + lVar22] =
                   *(float *)((long)__ptr_00 + lVar22 * 4) + prVar5[lVar15 + lVar22];
            }
          }
        }
      }
      else {
        lVar15 = 0;
        for (uVar20 = uVar17; (long)uVar20 < lVar13; uVar20 = uVar20 + 1) {
          if (((uVar20 != uVar24) && (lVar22 = uVar20 + lVar14, -1 < lVar22)) &&
             ((lVar22 < lVar11 && (lVar22 = sen[lVar22], lVar22 != -1)))) {
            for (lVar23 = 0; lVar25 != lVar23; lVar23 = lVar23 + 1) {
              *(float *)((long)__ptr + lVar23 * 4) =
                   prVar5[lVar22 * lVar2 + lVar23] + *(float *)((long)__ptr + lVar23 * 4);
            }
            lVar15 = lVar15 + 1;
          }
        }
        if (lVar15 != 0) {
          for (lVar22 = 0; prVar5 = expTable, pvVar4 = vocab, lVar25 != lVar22; lVar22 = lVar22 + 1)
          {
            *(float *)((long)__ptr + lVar22 * 4) =
                 *(float *)((long)__ptr + lVar22 * 4) / (float)lVar15;
          }
          if (hs != 0) {
            pvVar1 = vocab + lVar18;
            bVar16 = (byte)*(undefined4 *)&vocab[lVar18].codelen;
            if ((char)bVar16 < '\x01') {
              bVar16 = 0;
            }
            for (uVar20 = 0; prVar6 = syn1, uVar20 != bVar16; uVar20 = uVar20 + 1) {
              lVar15 = pvVar4[lVar18].point[uVar20] * lVar2;
              fVar27 = 0.0;
              for (lVar22 = 0; lVar25 != lVar22; lVar22 = lVar22 + 1) {
                fVar27 = fVar27 + *(float *)((long)__ptr + lVar22 * 4) * syn1[lVar15 + lVar22];
              }
              if (ABS(fVar27) < 6.0) {
                fVar27 = ((float)(1 - pvVar1->code[uVar20]) - prVar5[(int)((fVar27 + 6.0) * 83.0)])
                         * alpha;
                for (lVar22 = 0; lVar25 != lVar22; lVar22 = lVar22 + 1) {
                  *(float *)((long)__ptr_00 + lVar22 * 4) =
                       prVar6[lVar15 + lVar22] * fVar27 + *(float *)((long)__ptr_00 + lVar22 * 4);
                }
                for (lVar22 = 0; lVar25 != lVar22; lVar22 = lVar22 + 1) {
                  prVar6[lVar15 + lVar22] =
                       *(float *)((long)__ptr + lVar22 * 4) * fVar27 + prVar6[lVar15 + lVar22];
                }
              }
            }
          }
          prVar5 = expTable;
          piVar3 = table;
          uVar20 = (ulong)(uint)negative;
          if (0 < negative) {
            uVar19 = vocab_size - 1;
            for (lVar15 = 0; prVar6 = syn1neg, lVar15 != uVar20 + 1; lVar15 = lVar15 + 1) {
              if (lVar15 == 0) {
                iVar8 = 1;
                lVar22 = lVar18;
LAB_001037ef:
                lVar22 = lVar22 * lVar2;
                fVar27 = 0.0;
                for (lVar23 = 0; lVar25 != lVar23; lVar23 = lVar23 + 1) {
                  fVar27 = fVar27 + *(float *)((long)__ptr + lVar23 * 4) * syn1neg[lVar22 + lVar23];
                }
                if (fVar27 <= 6.0) {
                  fVar28 = (float)iVar8;
                  if (-6.0 <= fVar27) {
                    fVar28 = fVar28 - prVar5[(int)((fVar27 + 6.0) * 83.0)];
                  }
                }
                else {
                  fVar28 = (float)(iVar8 + -1);
                }
                fVar28 = fVar28 * alpha;
                for (lVar23 = 0; lVar25 != lVar23; lVar23 = lVar23 + 1) {
                  *(float *)((long)__ptr_00 + lVar23 * 4) =
                       prVar6[lVar22 + lVar23] * fVar28 + *(float *)((long)__ptr_00 + lVar23 * 4);
                }
                for (lVar23 = 0; lVar25 != lVar23; lVar23 = lVar23 + 1) {
                  prVar6[lVar22 + lVar23] =
                       *(float *)((long)__ptr + lVar23 * 4) * fVar28 + prVar6[lVar22 + lVar23];
                }
              }
              else {
                pvVar26 = (void *)((long)pvVar26 * 0x5deece66d + 0xb);
                lVar22 = (long)piVar3[((ulong)pvVar26 >> 0x10) % 100000000];
                if (lVar22 == 0) {
                  lVar22 = (ulong)pvVar26 % uVar19 + 1;
                }
                if (lVar22 != lVar18) {
                  iVar8 = 0;
                  goto LAB_001037ef;
                }
              }
            }
          }
          for (; prVar5 = syn0, (long)uVar17 < lVar13; uVar17 = uVar17 + 1) {
            if (((uVar17 != uVar24) && (lVar18 = uVar17 + lVar14, -1 < lVar18)) &&
               ((lVar18 < lVar11 && (sen[lVar18] != -1)))) {
              lVar18 = sen[lVar18] * lVar2;
              for (lVar15 = 0; lVar25 != lVar15; lVar15 = lVar15 + 1) {
                prVar5[lVar18 + lVar15] =
                     *(float *)((long)__ptr_00 + lVar15 * 4) + prVar5[lVar18 + lVar15];
              }
            }
          }
        }
      }
      local_2008 = local_2008 + 1;
      if (lVar11 <= local_2008) {
        lVar11 = 0;
      }
    }
  } while( true );
  word_count_actual = word_count_actual + (local_1ff8 - local_1fe8);
  local_1fc0 = local_1fc0 + -1;
  if (local_1fc0 == 0) {
    fclose(__stream);
    free(__ptr);
    free(__ptr_00);
    pthread_exit((void *)0x0);
  }
  lVar11 = file_size / (long)num_threads;
  goto LAB_00103237;
}

Assistant:

void *TrainModelThread(void *id) {
  long long a, b, d, cw, word, last_word, sentence_length = 0, sentence_position = 0;
  long long word_count = 0, last_word_count = 0, sen[MAX_SENTENCE_LENGTH + 1];
  long long l1, l2, c, target, label, local_iter = iter;
  unsigned long long next_random = (long long)id;
  real f, g;
  clock_t now;
  real *neu1 = (real *)calloc(layer1_size, sizeof(real));
  real *neu1e = (real *)calloc(layer1_size, sizeof(real));
    printf("Opening train file %s\n", train_file);
  FILE *fi = fopen(train_file, "rb");
  if (fi == NULL) {
    fprintf(stderr, "no such file or directory: %s", train_file);
    exit(1);
  }
  if (num_threads > 1) {
    fseek(fi, file_size / (long long)num_threads * (long long)id, SEEK_SET);
  }
  while (1) {
    if (word_count - last_word_count > 10000) {
      word_count_actual += word_count - last_word_count;
      last_word_count = word_count;
      if ((debug_mode > 1)) {
        now=clock();
        printf("%cAlpha: %f  Progress: %.2f%%  Words/thread/sec: %.2fk  ", 13, alpha,
         word_count_actual / (real)(iter * train_words + 1) * 100,
         word_count_actual / ((real)(now - start + 1) / (real)CLOCKS_PER_SEC * 1000));
        fflush(stdout);
      }
      alpha = starting_alpha * (1 - word_count_actual / (real)(iter * train_words + 1));
      if (alpha < starting_alpha * 0.0001) alpha = starting_alpha * 0.0001;
    }
    if (sentence_length == 0) {
      while (1) {
        word = ReadWordIndex(fi);
        if (feof(fi)) break;
        if (word == -1) continue;
        word_count++;
        if (word == 0) break;
        // The subsampling randomly discards frequent words while keeping the ranking same
        if (sample > 0) {
          real ran = (sqrt(vocab[word].cn / (sample * train_words)) + 1) * (sample * train_words) / vocab[word].cn;
          next_random = next_random * (unsigned long long)25214903917 + 11;
          if (ran < (next_random & 0xFFFF) / (real)65536) continue;
        }
        sen[sentence_length] = word;
        sentence_length++;
        if (sentence_length >= MAX_SENTENCE_LENGTH) break;
      }
      sentence_position = 0;
    }
    if (feof(fi) || (word_count > train_words / num_threads)) {
      word_count_actual += word_count - last_word_count;
      local_iter--;
      if (local_iter == 0) break;
      word_count = 0;
      last_word_count = 0;
      sentence_length = 0;
      fseek(fi, file_size / (long long)num_threads * (long long)id, SEEK_SET);
      continue;
    }
    word = sen[sentence_position];
    if (word == -1) continue;
    for (c = 0; c < layer1_size; c++) neu1[c] = 0;
    for (c = 0; c < layer1_size; c++) neu1e[c] = 0;
    next_random = next_random * (unsigned long long)25214903917 + 11;
    b = next_random % window;
    if (cbow) {  //train the cbow architecture
      // in -> hidden
      cw = 0;
      for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
        c = sentence_position - window + a;
        if (c < 0) continue;
        if (c >= sentence_length) continue;
        last_word = sen[c];
        if (last_word == -1) continue;
        for (c = 0; c < layer1_size; c++) neu1[c] += syn0[c + last_word * layer1_size];
        cw++;
      }
      if (cw) {
        for (c = 0; c < layer1_size; c++) neu1[c] /= cw;
        if (hs) for (d = 0; d < vocab[word].codelen; d++) {
          f = 0;
          l2 = vocab[word].point[d] * layer1_size;
          // Propagate hidden -> output
          for (c = 0; c < layer1_size; c++) f += neu1[c] * syn1[c + l2];
          if (f <= -MAX_EXP) continue;
          else if (f >= MAX_EXP) continue;
          else f = expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))];
          // 'g' is the gradient multiplied by the learning rate
          g = (1 - vocab[word].code[d] - f) * alpha;
          // Propagate errors output -> hidden
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1[c + l2];
          // Learn weights hidden -> output
          for (c = 0; c < layer1_size; c++) syn1[c + l2] += g * neu1[c];
        }
        // NEGATIVE SAMPLING
        if (negative > 0) for (d = 0; d < negative + 1; d++) {
          if (d == 0) {
            target = word;
            label = 1;
          } else {
            next_random = next_random * (unsigned long long)25214903917 + 11;
            target = table[(next_random >> 16) % table_size];
            if (target == 0) target = next_random % (vocab_size - 1) + 1;
            if (target == word) continue;
            label = 0;
          }
          l2 = target * layer1_size;
          f = 0;
          for (c = 0; c < layer1_size; c++) f += neu1[c] * syn1neg[c + l2];
          if (f > MAX_EXP) g = (label - 1) * alpha;
          else if (f < -MAX_EXP) g = (label - 0) * alpha;
          else g = (label - expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))]) * alpha;
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1neg[c + l2];
          for (c = 0; c < layer1_size; c++) syn1neg[c + l2] += g * neu1[c];
        }
        // hidden -> in
        for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
          c = sentence_position - window + a;
          if (c < 0) continue;
          if (c >= sentence_length) continue;
          last_word = sen[c];
          if (last_word == -1) continue;
          for (c = 0; c < layer1_size; c++) syn0[c + last_word * layer1_size] += neu1e[c];
        }
      }
    } else {  //train skip-gram
      for (a = b; a < window * 2 + 1 - b; a++) if (a != window) {
        c = sentence_position - window + a;
        if (c < 0) continue;
        if (c >= sentence_length) continue;
        last_word = sen[c];
        if (last_word == -1) continue;
        l1 = last_word * layer1_size;
        for (c = 0; c < layer1_size; c++) neu1e[c] = 0;
        // HIERARCHICAL SOFTMAX
        if (hs) for (d = 0; d < vocab[word].codelen; d++) {
          f = 0;
          l2 = vocab[word].point[d] * layer1_size;
          // Propagate hidden -> output
          for (c = 0; c < layer1_size; c++) f += syn0[c + l1] * syn1[c + l2];
          if (f <= -MAX_EXP) continue;
          else if (f >= MAX_EXP) continue;
          else f = expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))];
          // 'g' is the gradient multiplied by the learning rate
          g = (1 - vocab[word].code[d] - f) * alpha;
          // Propagate errors output -> hidden
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1[c + l2];
          // Learn weights hidden -> output
          for (c = 0; c < layer1_size; c++) syn1[c + l2] += g * syn0[c + l1];
        }
        // NEGATIVE SAMPLING
        if (negative > 0) for (d = 0; d < negative + 1; d++) {
          if (d == 0) {
            target = word;
            label = 1;
          } else {
            next_random = next_random * (unsigned long long)25214903917 + 11;
            target = table[(next_random >> 16) % table_size];
            if (target == 0) target = next_random % (vocab_size - 1) + 1;
            if (target == word) continue;
            label = 0;
          }
          l2 = target * layer1_size;
          f = 0;
          for (c = 0; c < layer1_size; c++) f += syn0[c + l1] * syn1neg[c + l2];
          if (f > MAX_EXP) g = (label - 1) * alpha;
          else if (f < -MAX_EXP) g = (label - 0) * alpha;
          else g = (label - expTable[(int)((f + MAX_EXP) * (EXP_TABLE_SIZE / MAX_EXP / 2))]) * alpha;
          for (c = 0; c < layer1_size; c++) neu1e[c] += g * syn1neg[c + l2];
          for (c = 0; c < layer1_size; c++) syn1neg[c + l2] += g * syn0[c + l1];
        }
        // Learn weights input -> hidden
        for (c = 0; c < layer1_size; c++) syn0[c + l1] += neu1e[c];
      }
    }
    sentence_position++;
    if (sentence_position >= sentence_length) {
      sentence_length = 0;
      continue;
    }
  }
  fclose(fi);
  free(neu1);
  free(neu1e);
  pthread_exit(NULL);
}